

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

size_t HTS_Tree_search_node(HTS_Tree *tree,char *string)

{
  HTS_Boolean HVar1;
  HTS_Node *pHVar2;
  HTS_Question *pHVar3;
  
  pHVar2 = tree->root;
  do {
    if (pHVar2 == (HTS_Node *)0x0) {
      HTS_error(0,"HTS_Tree_search_node: Cannot find node.\n");
      return 1;
    }
    pHVar3 = pHVar2->quest;
    if (pHVar3 == (HTS_Question *)0x0) {
      return pHVar2->pdf;
    }
    do {
      pHVar3 = (HTS_Question *)pHVar3->head;
      if (pHVar3 == (HTS_Question *)0x0) goto LAB_001560c7;
      HVar1 = HTS_pattern_match(string,pHVar3->string);
    } while (HVar1 == '\0');
    if (pHVar3 == (HTS_Question *)0x0) {
LAB_001560c7:
      pHVar2 = pHVar2->no;
    }
    else {
      pHVar2 = pHVar2->yes;
    }
    if (pHVar2->pdf != 0) {
      return pHVar2->pdf;
    }
  } while( true );
}

Assistant:

static size_t HTS_Tree_search_node(HTS_Tree * tree, const char *string)
{
   HTS_Node *node = tree->root;

   while (node != NULL) {
      if (node->quest == NULL)
         return node->pdf;
      if (HTS_Question_match(node->quest, string)) {
         if (node->yes->pdf > 0)
            return node->yes->pdf;
         node = node->yes;
      } else {
         if (node->no->pdf > 0)
            return node->no->pdf;
         node = node->no;
      }
   }

   HTS_error(0, "HTS_Tree_search_node: Cannot find node.\n");
   return 1;
}